

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.h
# Opt level: O0

StringRef __thiscall llvm::StringRef::rtrim(StringRef *this,StringRef Chars)

{
  size_t sVar1;
  StringRef SVar2;
  size_type sVar3;
  unsigned_long *puVar4;
  ulong uVar5;
  char *pcVar6;
  unsigned_long local_b0;
  StringRef *local_a8;
  StringRef *this_local;
  StringRef Chars_local;
  unsigned_long local_60;
  unsigned_long local_58;
  unsigned_long local_50;
  StringRef *local_48;
  StringRef *local_18;
  StringRef *local_10;
  
  Chars_local.Data = (char *)Chars.Length;
  this_local = (StringRef *)Chars.Data;
  sVar1 = this->Length;
  local_a8 = this;
  sVar3 = find_last_not_of(this,Chars,0xffffffffffffffff);
  local_b0 = sVar3 + 1;
  puVar4 = std::min<unsigned_long>(&this->Length,&local_b0);
  uVar5 = sVar1 - *puVar4;
  local_10 = this;
  if (this->Length < uVar5) {
    __assert_fail("size() >= N && \"Dropping more elements than exist\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/StringRef.h"
                  ,0x28f,"StringRef llvm::StringRef::drop_back(size_t) const");
  }
  local_58 = this->Length - uVar5;
  local_50 = 0;
  local_48 = this;
  local_18 = this;
  puVar4 = std::min<unsigned_long>(&local_50,&this->Length);
  local_50 = *puVar4;
  pcVar6 = this->Data + local_50;
  local_60 = this->Length - local_50;
  puVar4 = std::min<unsigned_long>(&local_58,&local_60);
  SVar2.Length = *puVar4;
  SVar2.Data = pcVar6;
  return SVar2;
}

Assistant:

LLVM_NODISCARD
    StringRef rtrim(StringRef Chars = " \t\n\v\f\r") const {
      return drop_back(Length - std::min(Length, find_last_not_of(Chars) + 1));
    }